

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::SSLClient::connect_with_proxy
          (SSLClient *this,Socket *socket,Response *res,bool *success,Error *error)

{
  socket_t sVar1;
  pthread_t pVar2;
  char cVar3;
  bool bVar4;
  pthread_t pVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  Response res3;
  Response res2;
  undefined8 *local_328;
  undefined8 uStack_320;
  code *local_318;
  code *pcStack_310;
  anon_class_32_4_86ec7540 *local_308;
  undefined8 uStack_300;
  code *local_2f8;
  code *pcStack_2f0;
  time_t local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2e0;
  ulong local_2d8;
  time_t tStack_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  Stream local_298;
  socket_t local_290;
  ulong local_288;
  time_t tStack_280;
  time_t local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_270;
  void *local_268;
  long local_260;
  long local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  Response local_240;
  Response local_138;
  
  *success = true;
  local_138.version._M_dataplus._M_p = (pointer)&local_138.version.field_2;
  local_138.version._M_string_length = 0;
  local_138.version.field_2._M_local_buf[0] = '\0';
  local_138.status = -1;
  local_138.reason._M_dataplus._M_p = (pointer)&local_138.reason.field_2;
  local_138.reason._M_string_length = 0;
  local_138.reason.field_2._M_local_buf[0] = '\0';
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.body._M_dataplus._M_p = (pointer)&local_138.body.field_2;
  local_138.body._M_string_length = 0;
  local_138.body.field_2._M_local_buf[0] = '\0';
  local_138.location._M_dataplus._M_p = (pointer)&local_138.location.field_2;
  local_138.location._M_string_length = 0;
  local_138.location.field_2._M_local_buf[0] = '\0';
  local_138.content_length_ = 0;
  local_138.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_138.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  local_138.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_138.content_provider_._M_invoker = (_Invoker_type)0x0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object
       = (void *)0x0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
  local_138.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
  local_138._250_8_ = 0;
  sVar1 = socket->sock;
  local_2d8 = (this->super_ClientImpl).read_timeout_sec_;
  tStack_2d0 = (this->super_ClientImpl).read_timeout_usec_;
  local_2e8 = (this->super_ClientImpl).write_timeout_sec_;
  paStack_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(this->super_ClientImpl).write_timeout_usec_;
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328 = (undefined8 *)0x0;
  uStack_320 = 0;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_328 = (undefined8 *)operator_new(0x18);
  *local_328 = this;
  local_328[1] = &local_138;
  local_328[2] = error;
  pcStack_310 = std::
                _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:7991:52)>
                ::_M_invoke;
  local_318 = std::
              _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:7991:52)>
              ::_M_manager;
  local_240.version._M_dataplus._M_p = (pointer)&PTR__SocketStream_0019cad8;
  local_240.version._M_string_length = CONCAT44(local_240.version._M_string_length._4_4_,sVar1);
  local_240.version.field_2._M_allocated_capacity = local_2d8;
  local_240.version.field_2._8_8_ = tStack_2d0;
  local_240._32_8_ = local_2e8;
  local_240.reason._M_dataplus._M_p = (pointer)paStack_2e0;
  local_240.reason._M_string_length = (size_type)operator_new(0x1000);
  uVar6 = local_240.reason._M_string_length + 0x1000;
  local_240.reason.field_2._8_8_ = uVar6;
  memset((void *)local_240.reason._M_string_length,0,0x1000);
  local_240.headers._M_t._M_impl._0_8_ = 0;
  local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_240.reason.field_2._M_allocated_capacity = uVar6;
  if (local_318 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  cVar3 = (*pcStack_310)(&local_328,&local_240);
  local_240.version._M_dataplus._M_p = (pointer)&PTR__SocketStream_0019cad8;
  if ((void *)local_240.reason._M_string_length != (void *)0x0) {
    operator_delete((void *)local_240.reason._M_string_length,
                    local_240.reason.field_2._8_8_ - local_240.reason._M_string_length);
  }
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  if (cVar3 == '\0') {
    (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,1);
    if (socket->sock != -1) {
      shutdown(socket->sock,2);
    }
    if ((this->super_ClientImpl).socket_requests_in_flight_ != 0) {
      pVar2 = (this->super_ClientImpl).socket_requests_are_from_thread_._M_thread;
      pVar5 = pthread_self();
      if (pVar2 != pVar5) {
LAB_0013bb7d:
        __assert_fail("socket_requests_in_flight_ == 0 || socket_requests_are_from_thread_ == std::this_thread::get_id()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                      ,0x1897,"void httplib::ClientImpl::close_socket(Socket &)");
      }
    }
    if (socket->ssl != (SSL *)0x0) {
LAB_0013bb5e:
      __assert_fail("socket.ssl == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                    ,0x189b,"void httplib::ClientImpl::close_socket(Socket &)");
    }
    if (socket->sock != -1) {
      close(socket->sock);
      socket->sock = -1;
    }
    *success = false;
  }
  else {
    bVar7 = true;
    if (local_138.status != 0x197) goto LAB_0013babb;
    if (((this->super_ClientImpl).proxy_digest_auth_username_._M_string_length != 0) &&
       ((this->super_ClientImpl).proxy_digest_auth_password_._M_string_length != 0)) {
      local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_2c8._M_impl.super__Rb_tree_header._M_header;
      local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar4 = detail::parse_www_authenticate
                        (&local_138,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2c8,true);
      if (bVar4) {
        local_240.version._M_dataplus._M_p = (pointer)&local_240.version.field_2;
        local_240.version._M_string_length = 0;
        local_240.version.field_2._M_allocated_capacity =
             local_240.version.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_240.status = 0xffffffff;
        local_240.reason._M_dataplus._M_p = (pointer)&local_240.reason.field_2;
        local_240.reason._M_string_length = 0;
        local_240.reason.field_2._M_allocated_capacity =
             local_240.reason.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_240.body._M_dataplus._M_p = (pointer)&local_240.body.field_2;
        local_240.body._M_string_length = 0;
        local_240.body.field_2._M_local_buf[0] = '\0';
        local_240.location._M_dataplus._M_p = (pointer)&local_240.location.field_2;
        local_240.location._M_string_length = 0;
        local_240.location.field_2._M_local_buf[0] = '\0';
        local_240.content_length_ = 0;
        local_240.content_provider_.super__Function_base._M_functor._M_unused._M_object =
             (void *)0x0;
        local_240.content_provider_.super__Function_base._M_functor._8_8_ = 0;
        local_240.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
        local_240.content_provider_._M_invoker = (_Invoker_type)0x0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
        local_240.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
        local_240._250_8_ = 0;
        sVar1 = socket->sock;
        local_2d8 = (this->super_ClientImpl).read_timeout_sec_;
        tStack_2d0 = (this->super_ClientImpl).read_timeout_usec_;
        local_2e8 = (this->super_ClientImpl).write_timeout_sec_;
        paStack_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(this->super_ClientImpl).write_timeout_usec_;
        local_2f8 = (code *)0x0;
        pcStack_2f0 = (code *)0x0;
        local_308 = (anon_class_32_4_86ec7540 *)0x0;
        uStack_300 = 0;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_308 = (anon_class_32_4_86ec7540 *)operator_new(0x20);
        local_308->this = this;
        local_308->auth =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2c8;
        local_308->res3 = &local_240;
        local_308->error = error;
        pcStack_2f0 = std::
                      _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:8014:58)>
                      ::_M_invoke;
        local_2f8 = std::
                    _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:8014:58)>
                    ::_M_manager;
        local_298._vptr_Stream = (_func_int **)&PTR__SocketStream_0019cad8;
        local_288 = local_2d8;
        tStack_280 = tStack_2d0;
        local_278 = local_2e8;
        paStack_270 = paStack_2e0;
        local_290 = sVar1;
        local_268 = operator_new(0x1000);
        lVar8 = (long)local_268 + 0x1000;
        local_258 = lVar8;
        memset(local_268,0,0x1000);
        local_250 = 0;
        uStack_248 = 0;
        local_260 = lVar8;
        bVar4 = connect_with_proxy::anon_class_32_4_86ec7540::operator()(local_308,&local_298);
        local_298._vptr_Stream = (_func_int **)&PTR__SocketStream_0019cad8;
        if (local_268 != (void *)0x0) {
          operator_delete(local_268,local_258 - (long)local_268);
        }
        if (local_2f8 != (code *)0x0) {
          (*local_2f8)(&local_308,&local_308,3);
        }
        if (!bVar4) {
          (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,1);
          if (socket->sock != -1) {
            shutdown(socket->sock,2);
          }
          if ((this->super_ClientImpl).socket_requests_in_flight_ != 0) {
            pVar2 = (this->super_ClientImpl).socket_requests_are_from_thread_._M_thread;
            pVar5 = pthread_self();
            if (pVar2 != pVar5) goto LAB_0013bb7d;
          }
          if (socket->ssl != (SSL *)0x0) goto LAB_0013bb5e;
          if (socket->sock != -1) {
            close(socket->sock);
            socket->sock = -1;
          }
          *success = false;
          Response::~Response(&local_240);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_2c8);
          goto LAB_0013bab9;
        }
        Response::~Response(&local_240);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_2c8);
      goto LAB_0013babb;
    }
    Response::operator=(res,&local_138);
  }
LAB_0013bab9:
  bVar7 = false;
LAB_0013babb:
  Response::~Response(&local_138);
  return bVar7;
}

Assistant:

inline bool SSLClient::connect_with_proxy(Socket &socket, Response &res,
                                          bool &success, Error &error) {
  success = true;
  Response res2;
  if (!detail::process_client_socket(
          socket.sock, read_timeout_sec_, read_timeout_usec_,
          write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
            Request req2;
            req2.method = "CONNECT";
            req2.path = host_and_port_;
            return process_request(strm, req2, res2, false, error);
          })) {
    // Thread-safe to close everything because we are assuming there are no
    // requests in flight
    shutdown_ssl(socket, true);
    shutdown_socket(socket);
    close_socket(socket);
    success = false;
    return false;
  }

  if (res2.status == 407) {
    if (!proxy_digest_auth_username_.empty() &&
        !proxy_digest_auth_password_.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res2, auth, true)) {
        Response res3;
        if (!detail::process_client_socket(
                socket.sock, read_timeout_sec_, read_timeout_usec_,
                write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
                  Request req3;
                  req3.method = "CONNECT";
                  req3.path = host_and_port_;
                  req3.headers.insert(detail::make_digest_authentication_header(
                      req3, auth, 1, detail::random_string(10),
                      proxy_digest_auth_username_, proxy_digest_auth_password_,
                      true));
                  return process_request(strm, req3, res3, false, error);
                })) {
          // Thread-safe to close everything because we are assuming there are
          // no requests in flight
          shutdown_ssl(socket, true);
          shutdown_socket(socket);
          close_socket(socket);
          success = false;
          return false;
        }
      }
    } else {
      res = res2;
      return false;
    }
  }

  return true;
}